

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O2

DataHeader *
pointerTOCLookupFn(UDataMemory *pData,char *name,int32_t *pLength,UErrorCode *pErrorCode)

{
  int *piVar1;
  int32_t iVar2;
  int32_t iVar3;
  DataHeader *pDVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int local_4c;
  int32_t local_48;
  int32_t local_44;
  int32_t *local_40;
  char *local_38;
  ulong uVar9;
  
  piVar1 = (int *)pData->toc;
  if (piVar1 == (int *)0x0) {
    pDVar4 = pData->pHeader;
  }
  else {
    iVar12 = *piVar1;
    local_44 = 0;
    local_48 = 0;
    if ((long)iVar12 != 0) {
      piVar7 = piVar1 + 2;
      local_40 = pLength;
      iVar2 = strcmpAfterPrefix(name,*(char **)piVar7,&local_44);
      if (iVar2 == 0) {
        uVar10 = 0;
LAB_002f19c8:
        *local_40 = -1;
        pDVar4 = UDataMemory_normalizeDataPointer_63
                           (*(void **)(piVar1 + (uVar10 & 0xffffffff) * 4 + 4));
        return pDVar4;
      }
      uVar10 = (long)iVar12 - 1;
      local_38 = name;
      iVar2 = strcmpAfterPrefix(name,*(char **)(piVar7 + uVar10 * 4),&local_48);
      if (iVar2 == 0) {
        if (0 < iVar12) goto LAB_002f19c8;
      }
      else {
        iVar12 = 1;
        iVar5 = local_44;
        iVar2 = local_48;
        while (iVar6 = iVar2, uVar9 = uVar10, iVar8 = (int)uVar9, iVar12 < iVar8) {
          uVar11 = (uint)(iVar12 + iVar8) >> 1;
          uVar10 = (ulong)uVar11;
          local_4c = iVar6;
          if (iVar5 < iVar6) {
            local_4c = iVar5;
          }
          iVar3 = strcmpAfterPrefix(local_38,*(char **)(piVar7 + uVar10 * 4),&local_4c);
          iVar2 = local_4c;
          if (-1 < iVar3) {
            if (iVar3 == 0) goto LAB_002f19c8;
            iVar12 = uVar11 + 1;
            uVar10 = uVar9;
            iVar5 = local_4c;
            iVar2 = iVar6;
          }
        }
      }
    }
    pDVar4 = (DataHeader *)0x0;
  }
  return pDVar4;
}

Assistant:

static const DataHeader * U_CALLCONV pointerTOCLookupFn(const UDataMemory *pData,
                   const char *name,
                   int32_t *pLength,
                   UErrorCode *pErrorCode) {
    (void)pErrorCode;
    if(pData->toc!=NULL) {
        const PointerTOC *toc = (PointerTOC *)pData->toc;
        int32_t number, count=(int32_t)toc->count;

#if defined (UDATA_DEBUG_DUMP)
        /* list the contents of the TOC each time .. not recommended */
        for(number=0; number<count; ++number) {
            fprintf(stderr, "\tx%d: %s\n", number, toc->entry[number].entryName);
        }
#endif
        number=pointerTOCPrefixBinarySearch(name, toc->entry, count);
        if(number>=0) {
            /* found it */
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Found.\n", toc->entry[number].entryName);
#endif
            *pLength=-1;
            return UDataMemory_normalizeDataPointer(toc->entry[number].pHeader);
        } else {
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Not found.\n", name);
#endif
            return NULL;
        }
    } else {
        return pData->pHeader;
    }
}